

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SincResampler.cpp
# Opt level: O1

void SRCTools::SincResampler::KaizerWindow::windowedSinc
               (FIRCoefficient *kernel,uint order,double fc,double beta,double amp)

{
  bool bVar1;
  uint i;
  uint uVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  float fVar6;
  double f;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  
  dVar10 = 0.0;
  uVar2 = 1;
  dVar7 = 1.0;
  do {
    dVar7 = dVar7 * ((beta * 0.5) / (double)uVar2);
    dVar9 = dVar7 * dVar7;
    dVar11 = dVar10 * 1.11e-16;
    uVar2 = uVar2 + 1;
    uVar5 = -(ulong)(dVar11 < dVar9);
    dVar10 = (double)(~uVar5 & (ulong)dVar10 | (ulong)(dVar10 + dVar9) & uVar5);
  } while (dVar11 < dVar9);
  if (-1 < (int)order) {
    lVar4 = 0;
    uVar2 = order;
    do {
      dVar7 = (1.0 / (double)order) * (double)(int)uVar2;
      dVar7 = ABS(1.0 - dVar7 * dVar7);
      if (dVar7 < 0.0) {
        dVar7 = sqrt(dVar7);
      }
      else {
        dVar7 = SQRT(dVar7);
      }
      dVar11 = 0.0;
      uVar3 = 1;
      dVar9 = 1.0;
      do {
        dVar9 = dVar9 * ((dVar7 * beta * 0.5) / (double)uVar3);
        dVar12 = dVar9 * dVar9;
        dVar8 = dVar11 * 1.11e-16;
        uVar3 = uVar3 + 1;
        uVar5 = -(ulong)(dVar8 < dVar12);
        dVar11 = (double)(~uVar5 & (ulong)dVar11 | (ulong)(dVar11 + dVar12) & uVar5);
      } while (dVar8 < dVar12);
      dVar7 = 1.0;
      if (uVar2 != 0) {
        dVar9 = (double)(int)uVar2 * fc * 3.141592653589793;
        dVar7 = sin(dVar9);
        dVar7 = dVar7 / dVar9;
      }
      fVar6 = (float)((dVar11 + 1.0) * dVar7 * (((fc + fc) * amp) / (dVar10 + 1.0)));
      kernel[lVar4] = fVar6;
      kernel[order - (int)lVar4] = fVar6;
      lVar4 = lVar4 + 1;
      bVar1 = 1 < (int)uVar2;
      uVar2 = uVar2 - 2;
    } while (bVar1);
  }
  return;
}

Assistant:

void KaizerWindow::windowedSinc(FIRCoefficient kernel[], const unsigned int order, const double fc, const double beta, const double amp) {
	const double fc_pi = M_PI * fc;
	const double recipOrder = 1.0 / order;
	const double mult = 2.0 * fc * amp / bessel(beta);
	for (int i = order, j = 0; 0 <= i; i -= 2, ++j) {
		double xw = i * recipOrder;
		double win = bessel(beta * sqrt(fabs(1.0 - xw * xw)));
		double xs = i * fc_pi;
		double sinc = (i == 0) ? 1.0 : sin(xs) / xs;
		FIRCoefficient imp = FIRCoefficient(mult * sinc * win);
		kernel[j] = imp;
		kernel[order - j] = imp;
	}
}